

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

int safe_pcre2_match_16(pcre2_code_16 *code,PCRE2_SPTR16 subject,qsizetype length,
                       qsizetype startOffset,int options,pcre2_match_data_16 *matchData,
                       pcre2_match_context_16 *matchContext)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = pcre2_match_16();
  if (iVar2 == -0x2e) {
    lVar3 = __tls_get_addr(&PTR_006a9338);
    if (*(char *)(lVar3 + 0x98) == '\0') {
      safe_pcre2_match_16();
    }
    iVar2 = -0x2e;
    if (*(long *)(lVar3 + 0x90) == 0) {
      if (*(char *)(lVar3 + 0x98) == '\0') {
        safe_pcre2_match_16();
      }
      lVar4 = pcre2_jit_stack_create_16(0x8000,0x80000,0);
      lVar1 = *(long *)(lVar3 + 0x90);
      *(long *)(lVar3 + 0x90) = lVar4;
      if (lVar1 != 0) {
        pcre2_jit_stack_free_16();
      }
      iVar2 = pcre2_match_16(code,subject,length,startOffset,options,matchData);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

static int safe_pcre2_match_16(const pcre2_code_16 *code,
                               PCRE2_SPTR16 subject, qsizetype length,
                               qsizetype startOffset, int options,
                               pcre2_match_data_16 *matchData,
                               pcre2_match_context_16 *matchContext)
{
    int result = pcre2_match_16(code, subject, length,
                                startOffset, options, matchData, matchContext);

    if (result == PCRE2_ERROR_JIT_STACKLIMIT && !jitStacks) {
        // The default JIT stack size in PCRE is 32K,
        // we allocate from 32K up to 512K.
        jitStacks.reset(pcre2_jit_stack_create_16(32 * 1024, 512 * 1024, NULL));

        result = pcre2_match_16(code, subject, length,
                                startOffset, options, matchData, matchContext);
    }

    return result;
}